

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O2

int streamStateAlloc(roslz4_stream *str)

{
  undefined8 *__ptr;
  void *pvVar1;
  int iVar2;
  
  __ptr = (undefined8 *)malloc(0x58);
  iVar2 = -5;
  if (__ptr != (undefined8 *)0x0) {
    str->state = __ptr;
    str->block_size_id = -1;
    *__ptr = 1;
    *(undefined4 *)(__ptr + 1) = 1;
    *(undefined4 *)(__ptr + 4) = 0;
    pvVar1 = XXH32_init(0);
    __ptr[5] = pvVar1;
    if (pvVar1 == (void *)0x0) {
      free((void *)__ptr[2]);
      free(__ptr);
      str->state = (void *)0x0;
    }
    else {
      *(undefined4 *)(__ptr + 6) = 0;
      __ptr[2] = 0;
      __ptr[3] = 0;
      __ptr[8] = 0;
      __ptr[9] = 0;
      *(undefined4 *)(__ptr + 10) = 0;
      str->total_in = 0;
      str->total_out = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int streamStateAlloc(roslz4_stream *str) {
  stream_state *state = (stream_state*) malloc(sizeof(stream_state));
  if (state == NULL) {
    return ROSLZ4_MEMORY_ERROR; // Allocation of state failed
  }
  str->state = state;

  str->block_size_id = -1;
  state->block_independence_flag = 1;
  state->block_checksum_flag = 0;
  state->stream_checksum_flag = 1;

  state->finished = 0;

  state->xxh32_state = XXH32_init(0);
  if (state->xxh32_state == NULL) {
    if (state->buffer != NULL) {
      free(state->buffer);
    }
    free(state);
    str->state = NULL;
    return ROSLZ4_MEMORY_ERROR; // Allocation failed
  }
  state->stream_checksum = 0;
  state->stream_checksum_read = 0;

  state->wrote_header = 0;

  state->buffer_offset = 0;
  state->buffer_size = 0;
  state->buffer = NULL;

  state->block_size = 0;
  state->block_size_read = 0;
  state->block_uncompressed = 0;

  str->total_in = 0;
  str->total_out = 0;

  return ROSLZ4_OK;
}